

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

void SetRotation(FLinePortal *port)

{
  line_t *plVar1;
  line_t *plVar2;
  double dVar3;
  double dVar4;
  line_t *dst;
  double dVar5;
  
  if ((port != (FLinePortal *)0x0) && (plVar1 = port->mDestination, plVar1 != (line_t *)0x0)) {
    if (port->mType == '\x03') {
      port->mCosRot = 1.0;
      (port->mAngleDiff).Degrees = 0.0;
      port->mSinRot = 0.0;
    }
    else {
      plVar2 = port->mOrigin;
      dVar3 = c_atan2((plVar1->delta).Y,(plVar1->delta).X);
      dVar4 = c_atan2((plVar2->delta).Y,(plVar2->delta).X);
      dVar5 = (dVar3 * 57.29577951308232 - dVar4 * 57.29577951308232) + 180.0;
      dVar3 = dVar5 * 0.017453292519943295;
      dVar4 = c_sin(dVar3);
      port->mSinRot = dVar4;
      dVar3 = c_cos(dVar3);
      port->mCosRot = dVar3;
      (port->mAngleDiff).Degrees = dVar5;
      if (((plVar2->sidedef[0]->Flags & 0x40) == 0) && ((plVar1->sidedef[0]->Flags & 0x40) == 0)) {
        port->mFlags = port->mFlags & 0xef;
      }
      else {
        port->mFlags = port->mFlags | 0x10;
      }
    }
  }
  return;
}

Assistant:

static void SetRotation(FLinePortal *port)
{
	if (port != nullptr && port->mDestination != nullptr)
	{
		if (port->mType != PORTT_LINKED)
		{
			line_t *dst = port->mDestination;
			line_t *line = port->mOrigin;
			DAngle angle = dst->Delta().Angle() - line->Delta().Angle() + 180.;
			port->mSinRot = sindeg(angle.Degrees);	// Here precision matters so use the slower but more precise versions.
			port->mCosRot = cosdeg(angle.Degrees);
			port->mAngleDiff = angle;
			if ((line->sidedef[0]->Flags & WALLF_POLYOBJ) || (dst->sidedef[0]->Flags & WALLF_POLYOBJ))
			{
				port->mFlags |= PORTF_POLYOBJ;
			}
			else
			{
				port->mFlags &= ~PORTF_POLYOBJ;
			}
		}
		else
		{
			// Linked portals have no angular difference.
			port->mSinRot = 0.;
			port->mCosRot = 1.;
			port->mAngleDiff = 0.;
		}
	}
}